

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

Curl_dns_entry * Curl_dnscache_get(Curl_easy *data,char *hostname,int port,int ip_version)

{
  Curl_dnscache *dnscache_00;
  Curl_dns_entry *pCVar1;
  Curl_dns_entry *dns;
  Curl_dnscache *dnscache;
  int ip_version_local;
  int port_local;
  char *hostname_local;
  Curl_easy *data_local;
  
  dnscache_00 = dnscache_get(data);
  dnscache_lock(data,dnscache_00);
  pCVar1 = fetch_addr(data,dnscache_00,hostname,port,ip_version);
  if (pCVar1 != (Curl_dns_entry *)0x0) {
    pCVar1->refcount = pCVar1->refcount + 1;
  }
  dnscache_unlock(data,dnscache_00);
  return pCVar1;
}

Assistant:

struct Curl_dns_entry *
Curl_dnscache_get(struct Curl_easy *data,
                  const char *hostname,
                  int port,
                  int ip_version)
{
  struct Curl_dnscache *dnscache = dnscache_get(data);
  struct Curl_dns_entry *dns = NULL;

  dnscache_lock(data, dnscache);

  dns = fetch_addr(data, dnscache, hostname, port, ip_version);
  if(dns)
    dns->refcount++; /* we use it! */

  dnscache_unlock(data, dnscache);

  return dns;
}